

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  anon_union_8_9_d3d94a0b_for_AVSValue_2 this_00;
  bool bVar1;
  int iVar2;
  AVSValue *pAVar3;
  undefined8 *puVar4;
  long local_50;
  int local_44;
  int local_40;
  int i;
  int size;
  undefined1 local_30 [8];
  AVSValue arg;
  vector<long,_std::allocator<long>_> *output_local;
  char *name_local;
  AVSInDelegator *this_local;
  
  arg.field_2 = (anon_union_8_9_d3d94a0b_for_AVSValue_2)output;
  iVar2 = NameToIndex(this,name);
  pAVar3 = AVSValue::operator[](&this->_args,iVar2);
  AVSValue::AVSValue((AVSValue *)local_30,pAVar3);
  bVar1 = AVSValue::IsArray((AVSValue *)local_30);
  if (!bVar1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "Argument is not array";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  local_40 = AVSValue::ArraySize((AVSValue *)local_30);
  std::vector<long,_std::allocator<long>_>::clear
            ((vector<long,_std::allocator<long>_> *)arg.field_2.clip);
  for (local_44 = 0; this_00 = arg.field_2, local_44 < local_40; local_44 = local_44 + 1) {
    pAVar3 = AVSValue::operator[]((AVSValue *)local_30,local_44);
    iVar2 = AVSValue::AsInt(pAVar3);
    local_50 = (long)iVar2;
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)this_00.clip,&local_50);
  }
  AVSValue::~AVSValue((AVSValue *)local_30);
  return;
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }